

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd2.c
# Opt level: O3

int bcd2_sub(long *bcd_low,long *bcd_high,long subend)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong *puVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long tmp_hi;
  long tmp_lo;
  uint local_40 [2];
  uint local_38 [2];
  
  bin_bcd2(subend,(long *)local_38,(long *)local_40);
  bVar3 = 0;
  uVar4 = 0;
  lVar7 = 0;
  lVar2 = 0;
  do {
    puVar5 = (ulong *)bcd_low;
    if (6 < uVar4) {
      puVar5 = (ulong *)bcd_high;
    }
    uVar6 = local_38[0];
    bVar1 = bVar3;
    if (6 < uVar4) {
      uVar6 = local_40[0];
      bVar1 = bVar3 - 0x1c;
    }
    uVar8 = 0xf << (bVar1 & 0x1f);
    lVar7 = ((ulong)(((uint)*puVar5 & uVar8) >> (bVar1 & 0x3f)) + lVar7) -
            (ulong)((uVar6 & uVar8) >> (bVar1 & 0x3f));
    if (lVar7 < 0) {
      lVar2 = 1;
      lVar7 = lVar7 + 10;
    }
    *puVar5 = lVar7 << (bVar1 & 0x3f) | (ulong)((uVar8 ^ 0xfffffff) & (uint)*puVar5);
    uVar4 = uVar4 + 1;
    lVar7 = -lVar2;
    bVar3 = bVar3 + 4;
  } while (uVar4 != 0xe);
  return (int)lVar2;
}

Assistant:

int
bcd2_sub(long *bcd_low, long *bcd_high, long subend)
{
    long tmp_lo, tmp_hi, carry, res;
    int digit;

    bin_bcd2(subend, &tmp_lo, &tmp_hi);
    carry = 0;
    for (digit=0; digit < 14; digit++)
        {
        res = GET_DIGIT(digit, *bcd_low, *bcd_high); 
        res -= GET_DIGIT(digit, tmp_lo, tmp_hi);
        res -= carry;
        if (res < 0) 
			{
			res += 10;
			carry = 1;
			}
        SET_DIGIT(res, digit, bcd_low, bcd_high);
        }
    return(carry);
}